

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alphabet.c
# Opt level: O1

void vrna_aln_encode(char *sequence,short **S_p,short **s5_p,short **s3_p,char **ss_p,uint **as_p,
                    vrna_md_t *md)

{
  long lVar1;
  byte bVar2;
  short *psVar3;
  size_t sVar4;
  short *psVar5;
  uint *puVar6;
  char *pcVar7;
  short *psVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  
  sVar4 = strlen(sequence);
  uVar10 = (uint)sVar4;
  uVar13 = uVar10 * 2 + 4;
  psVar5 = (short *)vrna_alloc(uVar13);
  *s5_p = psVar5;
  psVar5 = (short *)vrna_alloc(uVar13);
  *s3_p = psVar5;
  puVar6 = (uint *)vrna_alloc(uVar10 * 4 + 8);
  *as_p = puVar6;
  pcVar7 = (char *)vrna_alloc(uVar10 + 2);
  *ss_p = pcVar7;
  psVar8 = vrna_seq_encode_simple(sequence,md);
  *S_p = psVar8;
  psVar5 = *s5_p;
  psVar5[0] = 0;
  psVar5[1] = 0;
  if (md->oldAliEn == 0) {
    if (md->circ == 0) {
      (*s3_p)[sVar4 & 0xffffffff] = 0;
      psVar5[1] = 0;
    }
    else {
      if (uVar10 == 0) {
        return;
      }
      uVar11 = sVar4 & 0xffffffff;
      do {
        bVar2 = sequence[uVar11 - 1];
        if (((1 < bVar2 - 0x2d) && (bVar2 != 0x5f)) && (bVar2 != 0x7e)) {
          psVar5[1] = psVar8[uVar11 & 0xffffffff];
          break;
        }
        uVar11 = uVar11 - 1;
      } while (uVar11 != 0);
      uVar13 = 1;
      do {
        bVar2 = sequence[uVar13 - 1];
        if (((1 < bVar2 - 0x2d) && (bVar2 != 0x5f)) && (bVar2 != 0x7e)) {
          (*s3_p)[sVar4 & 0xffffffff] = psVar8[uVar13];
          break;
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 <= uVar10);
    }
    if (uVar10 != 0) {
      uVar11 = 2;
      if (2 < uVar10 + 1) {
        uVar11 = (ulong)(uVar10 + 1);
      }
      lVar9 = 0;
      uVar10 = 0;
      do {
        bVar2 = sequence[lVar9];
        if (((bVar2 - 0x2d < 2) || (bVar2 == 0x7e)) || (bVar2 == 0x5f)) {
          psVar5 = *s5_p;
          psVar8 = psVar5;
        }
        else {
          uVar12 = (ulong)uVar10;
          uVar10 = uVar10 + 1;
          (*ss_p)[uVar12] = bVar2;
          psVar8 = *S_p;
          psVar5 = *s5_p;
        }
        psVar5[lVar9 + 2] = psVar8[lVar9 + 1];
        (*as_p)[lVar9 + 1] = uVar10;
        lVar9 = lVar9 + 1;
      } while (uVar11 - 1 != lVar9);
      uVar11 = sVar4 & 0xffffffff;
      do {
        bVar2 = sequence[uVar11 - 1];
        if (((bVar2 - 0x2d < 2) || (bVar2 == 0x7e)) || (bVar2 == 0x5f)) {
          psVar5 = *s3_p;
          psVar8 = psVar5;
        }
        else {
          psVar8 = *S_p;
          psVar5 = *s3_p;
        }
        psVar5[uVar11 - 1] = psVar8[uVar11];
        uVar11 = uVar11 - 1;
      } while (uVar11 != 0);
    }
  }
  else {
    **ss_p = *sequence;
    if (1 < uVar10) {
      lVar9 = 0;
      do {
        psVar5 = *S_p;
        (*s5_p)[lVar9 + 1] = psVar5[lVar9];
        (*s3_p)[lVar9 + 1] = psVar5[lVar9 + 2];
        (*ss_p)[lVar9 + 1] = sequence[lVar9 + 1];
        lVar1 = lVar9 + 1;
        (*as_p)[lVar9 + 1] = (uint)lVar1;
        lVar9 = lVar1;
      } while ((sVar4 & 0xffffffff) - 1 != lVar1);
    }
    uVar11 = sVar4 & 0xffffffff;
    (*ss_p)[uVar11] = sequence[uVar11];
    (*as_p)[uVar11] = uVar10;
    psVar5 = *S_p;
    psVar8 = *s5_p;
    psVar8[uVar11] = psVar5[uVar10 - 1];
    psVar3 = *s3_p;
    psVar3[uVar11] = 0;
    psVar5[uVar10 + 1] = psVar5[1];
    psVar8[1] = 0;
    if (md->circ != 0) {
      psVar8[1] = psVar5[uVar11];
      psVar3[uVar11] = psVar5[1];
      (*ss_p)[uVar10 + 1] = (char)psVar5[1];
    }
  }
  return;
}

Assistant:

PUBLIC void
vrna_aln_encode(const char    *sequence,
                short         **S_p,
                short         **s5_p,
                short         **s3_p,
                char          **ss_p,
                unsigned int  **as_p,
                vrna_md_t     *md)
{
  unsigned int i, l, p;

  l = strlen(sequence);

  (*s5_p) = (short *)vrna_alloc((l + 2) * sizeof(short));
  (*s3_p) = (short *)vrna_alloc((l + 2) * sizeof(short));
  (*as_p) = (unsigned int *)vrna_alloc((l + 2) * sizeof(unsigned int));
  (*ss_p) = (char *)vrna_alloc((l + 2) * sizeof(char));

  /* make numerical encoding of sequence */
  (*S_p) = vrna_seq_encode_simple(sequence, md);

  (*s5_p)[0] = (*s5_p)[1] = 0;

  if (md->oldAliEn) {
    /* use alignment sequences in all energy evaluations */
    (*ss_p)[0] = sequence[0];
    for (i = 1; i < l; i++) {
      (*s5_p)[i]  = (*S_p)[i - 1];
      (*s3_p)[i]  = (*S_p)[i + 1];
      (*ss_p)[i]  = sequence[i];
      (*as_p)[i]  = i;
    }
    (*ss_p)[l]    = sequence[l];
    (*as_p)[l]    = l;
    (*s5_p)[l]    = (*S_p)[l - 1];
    (*s3_p)[l]    = 0;
    (*S_p)[l + 1] = (*S_p)[1];
    (*s5_p)[1]    = 0;
    if (md->circ) {
      (*s5_p)[1]      = (*S_p)[l];
      (*s3_p)[l]      = (*S_p)[1];
      (*ss_p)[l + 1]  = (*S_p)[1];
    }
  } else {
    if (md->circ) {
      for (i = l; i > 0; i--) {
        char c5;
        c5 = sequence[i - 1];
        if ((c5 == '-') || (c5 == '_') || (c5 == '~') || (c5 == '.'))
          continue;

        (*s5_p)[1] = (*S_p)[i];
        break;
      }
      for (i = 1; i <= l; i++) {
        char c3;
        c3 = sequence[i - 1];
        if ((c3 == '-') || (c3 == '_') || (c3 == '~') || (c3 == '.'))
          continue;

        (*s3_p)[l] = (*S_p)[i];
        break;
      }
    } else {
      (*s5_p)[1] = (*s3_p)[l] = 0;
    }

    for (i = 1, p = 0; i <= l; i++) {
      char c5;
      c5 = sequence[i - 1];
      if ((c5 == '-') || (c5 == '_') || (c5 == '~') || (c5 == '.')) {
        (*s5_p)[i + 1] = (*s5_p)[i];
      } else {
        /* no gap */
        (*ss_p)[p++]    = sequence[i - 1]; /*start at 0!!*/
        (*s5_p)[i + 1]  = (*S_p)[i];
      }

      (*as_p)[i] = p;
    }
    for (i = l; i >= 1; i--) {
      char c3;
      c3 = sequence[i - 1];
      if ((c3 == '-') || (c3 == '_') || (c3 == '~') || (c3 == '.'))
        (*s3_p)[i - 1] = (*s3_p)[i];
      else
        (*s3_p)[i - 1] = (*S_p)[i];
    }
  }
}